

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O1

StreamException * __thiscall
Centaurus::Stream::toomany(StreamException *__return_storage_ptr__,Stream *this,int count)

{
  ostream *poVar1;
  ostringstream stream;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Line ",5);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_198,this->m_line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", Pos ",6);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_pos);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": The number of rules exceeded ",0x1f);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ostream::operator<<(poVar1,count);
  std::__cxx11::stringbuf::str();
  StreamException::StreamException(__return_storage_ptr__,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

StreamException toomany(int count)
    {
        std::ostringstream stream;

        stream << "Line " << m_line << ", Pos " << m_pos << ": The number of rules exceeded " << std::dec << count;

        return StreamException(stream.str());
    }